

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O1

int minisketch_implementation_supported(uint32_t bits,uint32_t implementation)

{
  long lVar1;
  Sketch *pSVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  if (implementation < 3 && bits == 0x20) {
    pSVar2 = anon_unknown.dwarf_4186bdc::Construct(bits,implementation);
    iVar3 = 0;
    if (pSVar2 != (Sketch *)0x0) {
      (*pSVar2->_vptr_Sketch[1])(pSVar2);
      iVar3 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int minisketch_implementation_supported(uint32_t bits, uint32_t implementation) {
    if (!minisketch_bits_supported(bits) || implementation > minisketch_implementation_max()) {
        return 0;
    }
    try {
        Sketch* sketch = Construct(bits, implementation);
        if (sketch) {
            delete sketch;
            return 1;
        }
    } catch (const std::bad_alloc&) {}
    return 0;
}